

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::decode6
          (Predecoder<(InstructionSet::M68k::Model)2> *this,uint16_t instruction)

{
  Preinstruction PVar1;
  Preinstruction PVar2;
  uint uVar3;
  Preinstruction PVar4;
  char cVar5;
  
  cVar5 = (char)instruction;
  if ((instruction & 0xf00) == 0x100) {
    PVar1.operation = BSRl;
    PVar1.operands_[0] = '`';
    PVar1.operands_[1] = 'h';
    PVar1.flags_ = '\x02';
    PVar4.operation = BSRb;
    PVar4.operands_[0] = 'p';
    PVar4.operands_[1] = 'h';
    PVar4.flags_ = '\0';
    if (cVar5 == -1) {
      PVar4 = PVar1;
    }
    PVar2.operation = BSRw;
    PVar2.operands_[0] = '`';
    PVar2.operands_[1] = 'h';
    PVar2.flags_ = '\x01';
    if (cVar5 != '\0') {
      PVar2 = PVar4;
    }
    return PVar2;
  }
  uVar3 = ((instruction & 0xf00) >> 8) << 0x1a;
  if (cVar5 != -1) {
    if ((instruction & 0xff) == 0) {
      return (Preinstruction)(uVar3 | 0x1686039);
    }
    return (Preinstruction)(uVar3 | 0x687038);
  }
  return (Preinstruction)(uVar3 | 0x26860a8);
}

Assistant:

Preinstruction Predecoder<model>::decode6(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xf00) {
		// 4-59 (p163)
		case 0x100:
			switch(instruction & 0xff) {
				case 0x00:	Decode(Op::BSRw);
				case 0xff:
					if constexpr (model >= Model::M68020) {
						Decode(Op::BSRl);
					}
					[[fallthrough]];
				default:	Decode(Op::BSRb);
			}

		// 4-25 (p129) Bcc
		// 4-55 (p159) BRA (i.e. Bcc with cc = always)
		default:
			switch(instruction & 0xff) {
				case 0x00:	Decode(Op::Bccw);
				case 0xff:
					if constexpr (model >= Model::M68020) {
						Decode(Op::Bccl);
					}
					[[fallthrough]];
				default:	Decode(Op::Bccb);
			}
	}
}